

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ShmSystemV.cpp
# Opt level: O2

void __thiscall
adios2::transport::ShmSystemV::Write(ShmSystemV *this,char *buffer,size_t size,size_t start)

{
  allocator local_91;
  string local_90;
  string local_70;
  string local_50;
  
  std::__cxx11::string::string((string *)&local_90,"in call to Write",&local_91);
  CheckSizes(this,size,start,&local_90);
  std::__cxx11::string::~string((string *)&local_90);
  std::__cxx11::string::string((string *)&local_50,"write",&local_91);
  Transport::ProfilerStart(&this->super_Transport,&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  memcpy(this->m_Buffer + start,buffer,size);
  std::__cxx11::string::string((string *)&local_70,"write",&local_91);
  Transport::ProfilerStop(&this->super_Transport,&local_70);
  std::__cxx11::string::~string((string *)&local_70);
  return;
}

Assistant:

void ShmSystemV::Write(const char *buffer, size_t size, size_t start)
{
    CheckSizes(size, start, "in call to Write");
    ProfilerStart("write");
    std::memcpy(&m_Buffer[start], buffer, size);
    ProfilerStop("write");
}